

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O1

int __thiscall MSH::mesh_file::scan_Nodes(mesh_file *this,fstream *mesh_file,string *line_buffer)

{
  double dVar1;
  char cVar2;
  int iVar3;
  size_type sVar4;
  int *piVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_str_vec;
  pair<const_int,_MSH::node> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  mesh_file *local_70;
  double local_68;
  double local_60;
  char *local_58;
  char *local_50;
  anon_union_16_2_ba345be5_for_m_Storage local_48;
  ulong local_38;
  
  local_70 = this;
  iVar3 = std::__cxx11::string::compare((char *)line_buffer);
  do {
    if (iVar3 == 0) {
      return 0;
    }
    cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)mesh_file + -0x18) + (char)mesh_file);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)mesh_file,(string *)line_buffer,cVar2);
    local_a8._0_8_ = "\r";
    local_a8.second.x = 7.60730167199372e-318;
    pcVar9 = (line_buffer->_M_dataplus)._M_p;
    sVar4 = line_buffer->_M_string_length;
    pcVar8 = pcVar9 + sVar4;
    for (; pcVar10 = pcVar8, sVar4 != 0; sVar4 = sVar4 - 1) {
      if (*pcVar9 == '\r') {
        pcVar8 = pcVar9 + 1;
        pcVar10 = pcVar9;
        break;
      }
      pcVar9 = pcVar9 + 1;
    }
    if (pcVar10 != pcVar8) {
      boost::algorithm::detail::
      find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::empty_formatF<char>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::empty_container<char>>
                (line_buffer);
    }
    iVar3 = std::__cxx11::string::compare((char *)line_buffer);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = check_read_state(mesh_file);
    if (iVar3 != 0) {
      return 1;
    }
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._0_8_ = " ";
    local_a8.second.x = 7.6585906266885e-318;
    boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
              ((is_any_ofF<char> *)&local_48,(iterator_range<const_char_*> *)&local_a8);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              (&local_88,line_buffer,(is_any_ofF<char> *)&local_48,token_compress_off);
    if ((0x10 < local_38) && (local_48.m_dynSet != (set_value_type *)0x0)) {
      operator_delete__(local_48.m_dynSet);
    }
    if ((long)local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x80) {
      pcVar8 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      piVar5 = __errno_location();
      iVar3 = *piVar5;
      *piVar5 = 0;
      pcVar9 = (char *)strtod(pcVar8,(char **)&local_a8);
      if ((char *)local_a8._0_8_ == pcVar8) {
LAB_0013f6c1:
        std::__throw_invalid_argument("stod");
LAB_0013f6cd:
        std::__throw_out_of_range("stoi");
LAB_0013f6d9:
        std::__throw_out_of_range("stod");
      }
      else {
        local_58 = pcVar9;
        if (*piVar5 != 0) {
          if (*piVar5 != 0x22) goto LAB_0013f533;
          goto LAB_0013f6d9;
        }
        *piVar5 = iVar3;
LAB_0013f533:
        pcVar8 = local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        iVar3 = *piVar5;
        *piVar5 = 0;
        dVar1 = strtod(pcVar8,(char **)&local_a8);
        if ((char *)local_a8._0_8_ == pcVar8) {
LAB_0013f6b5:
          std::__throw_invalid_argument("stod");
          goto LAB_0013f6c1;
        }
        local_60 = dVar1;
        if (*piVar5 == 0) {
          *piVar5 = iVar3;
LAB_0013f57c:
          pcVar8 = local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          iVar3 = *piVar5;
          *piVar5 = 0;
          dVar1 = strtod(pcVar8,(char **)&local_a8);
          if ((char *)local_a8._0_8_ == pcVar8) {
LAB_0013f6a9:
            std::__throw_invalid_argument("stod");
            goto LAB_0013f6b5;
          }
          local_68 = dVar1;
          if (*piVar5 == 0) {
            *piVar5 = iVar3;
          }
          else if (*piVar5 == 0x22) goto LAB_0013f6f1;
          pcVar8 = ((local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          iVar3 = *piVar5;
          *piVar5 = 0;
          lVar6 = strtol(pcVar8,&local_50,10);
          if (local_50 == pcVar8) {
            std::__throw_invalid_argument("stoi");
            goto LAB_0013f6a9;
          }
          if (((int)lVar6 == lVar6) && (*piVar5 != 0x22)) {
            if (*piVar5 == 0) {
              *piVar5 = iVar3;
            }
            local_a8.first = (int)lVar6;
            local_a8.second.x = (double)local_58;
            local_a8.second.y = local_60;
            local_a8.second.z = local_68;
            std::
            _Rb_tree<int,std::pair<int_const,MSH::node>,std::_Select1st<std::pair<int_const,MSH::node>>,std::less<int>,std::allocator<std::pair<int_const,MSH::node>>>
            ::_M_insert_unique<std::pair<int_const,MSH::node>>
                      ((_Rb_tree<int,std::pair<int_const,MSH::node>,std::_Select1st<std::pair<int_const,MSH::node>>,std::less<int>,std::allocator<std::pair<int_const,MSH::node>>>
                        *)local_70,&local_a8);
            goto LAB_0013f65f;
          }
          goto LAB_0013f6cd;
        }
        if (*piVar5 != 0x22) goto LAB_0013f57c;
      }
      std::__throw_out_of_range("stod");
LAB_0013f6f1:
      uVar7 = std::__throw_out_of_range("stod");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      _Unwind_Resume(uVar7);
    }
LAB_0013f65f:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    iVar3 = std::__cxx11::string::compare((char *)line_buffer);
  } while( true );
}

Assistant:

int MSH::mesh_file::scan_Nodes(std::fstream &mesh_file, std::string &line_buffer)
{
    while (line_buffer!="EndNodes")
    {
        getline(mesh_file,line_buffer);
        boost::erase_all(line_buffer, "\r");
        if (line_buffer=="$EndNodes")
            break;
        if (check_read_state(mesh_file))
            return EXIT_FAILURE;
        std::vector<std::string> split_str_vec;
        boost::split(split_str_vec, line_buffer, boost::is_any_of(" "));
        if (split_str_vec.size()==4)
        {
            node input_node;
            input_node.x = std::stod(split_str_vec[1]);
            input_node.y = std::stod(split_str_vec[2]);
            input_node.z = std::stod(split_str_vec[3]);
            nodes_map.insert({std::stoi(split_str_vec[0]),input_node});
        }
    }
    return EXIT_SUCCESS;
}